

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

drwav_uint64 drwav_read_f32__mulaw(drwav *pWav,drwav_uint64 samplesToRead,float *pBufferOut)

{
  drwav_uint64 sampleCount;
  ulong samplesToRead_00;
  drwav_uint64 dVar1;
  uchar sampleData [4096];
  drwav_uint8 adStack_1038 [4104];
  
  if (pWav->bytesPerSample == 0) {
    dVar1 = 0;
  }
  else {
    dVar1 = 0;
    for (; samplesToRead != 0; samplesToRead = samplesToRead - sampleCount) {
      samplesToRead_00 = (ulong)(0x1000 / pWav->bytesPerSample);
      if (samplesToRead < samplesToRead_00) {
        samplesToRead_00 = samplesToRead;
      }
      sampleCount = drwav_read(pWav,samplesToRead_00,adStack_1038);
      if (sampleCount == 0) {
        return dVar1;
      }
      drwav_mulaw_to_f32(pBufferOut,adStack_1038,sampleCount);
      pBufferOut = pBufferOut + sampleCount;
      dVar1 = dVar1 + sampleCount;
    }
  }
  return dVar1;
}

Assistant:

drwav_uint64 drwav_read_f32__mulaw(drwav* pWav, drwav_uint64 samplesToRead, float* pBufferOut) {
    if (pWav->bytesPerSample == 0) {
        return 0;
    }

    drwav_uint64 totalSamplesRead = 0;
    unsigned char sampleData[4096];
    while (samplesToRead > 0) {
        drwav_uint64 samplesRead =
            drwav_read(pWav, drwav_min(samplesToRead, sizeof(sampleData) / pWav->bytesPerSample), sampleData);
        if (samplesRead == 0) {
            break;
        }

        drwav_mulaw_to_f32(pBufferOut, sampleData, (size_t)samplesRead);

        pBufferOut += samplesRead;
        samplesToRead -= samplesRead;
        totalSamplesRead += samplesRead;
    }

    return totalSamplesRead;
}